

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

void __thiscall
asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::initiate_async_connect::operator()
          (initiate_async_connect *this,function<void_(const_std::error_code_&)> *handler,
          endpoint_type *peer_endpoint,error_code *open_ec)

{
  bool bVar1;
  error_code *in_RCX;
  function<void_(const_std::error_code_&)> *in_RDX;
  endpoint_type *in_RSI;
  implementation_type *in_RDI;
  reactive_socket_service<asio::ip::tcp> *unaff_retaddr;
  non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> handler2;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff48;
  error_code *in_stack_ffffffffffffff50;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff58;
  constraint_t<(execution::is_executor<any_io_executor>::value_&&_can_require<any_io_executor,_execution::blocking_t::never_t>::value)____is_executor<any_io_executor>::value>
  in_stack_ffffffffffffff94;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *in_stack_ffffffffffffff98
  ;
  any_io_executor *in_stack_ffffffffffffffa0;
  implementation_type *impl;
  
  impl = in_RDI;
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    asio::detail::
    io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
    get_executor(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   **)&in_RDI->super_base_implementation_type);
    asio::detail::bind_handler<std::function<void(std::error_code_const&)>&,std::error_code>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    post<asio::any_io_executor,_asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::~binder1
              ((binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)0x704455);
  }
  else {
    asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&)>_&>::
    non_const_lvalue((non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> *)
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    asio::detail::
    io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
    get_service(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                  **)&in_RDI->super_base_implementation_type);
    asio::detail::
    io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
    get_implementation(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                         **)&in_RDI->super_base_implementation_type);
    asio::detail::
    io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
    get_executor(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   **)&in_RDI->super_base_implementation_type);
    asio::detail::reactive_socket_service<asio::ip::tcp>::
    async_connect<std::function<void(std::error_code_const&)>,asio::any_io_executor>
              (unaff_retaddr,impl,in_RSI,in_RDX,(any_io_executor *)in_RCX);
    asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&)>_&>::
    ~non_const_lvalue((non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> *)0x7044f8)
    ;
  }
  return;
}

Assistant:

void operator()(ConnectHandler&& handler,
        const endpoint_type& peer_endpoint,
        const asio::error_code& open_ec) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a ConnectHandler.
      ASIO_CONNECT_HANDLER_CHECK(ConnectHandler, handler) type_check;

      if (open_ec)
      {
          asio::post(self_->impl_.get_executor(),
              asio::detail::bind_handler(
                static_cast<ConnectHandler&&>(handler), open_ec));
      }
      else
      {
        detail::non_const_lvalue<ConnectHandler> handler2(handler);
        self_->impl_.get_service().async_connect(
            self_->impl_.get_implementation(), peer_endpoint,
            handler2.value, self_->impl_.get_executor());
      }
    }